

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateInlineAccessorDefinitions(SingularStringView *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined1 auVar1 [8];
  bool bVar2;
  Sub *local_498;
  basic_string_view<char,_std::char_traits<char>_> local_440;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  undefined1 local_411;
  anon_class_16_2_fd512ddd_for_cb local_410;
  allocator<char> local_3f9;
  string local_3f8;
  anon_class_16_2_d7082a65_for_cb local_3d8;
  allocator<char> local_3c1;
  string local_3c0;
  anon_class_16_2_d7082a65_for_cb local_3a0;
  allocator<char> local_389;
  string local_388;
  anon_class_16_2_fd512ddd_for_cb local_368 [2];
  allocator<char> local_341;
  string local_340;
  Sub *local_320;
  Sub local_318;
  Sub local_260;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  SingularStringView *this_local;
  
  local_411 = 1;
  local_320 = &local_318;
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"if_IsDefault",&local_341)
  ;
  local_368[0].p = (Printer **)local_18;
  local_368[0].this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularStringView::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__0>
            (&local_318,&local_340,local_368);
  local_320 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"update_hasbit",&local_389);
  local_3a0.p = (Printer **)local_18;
  local_3a0.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularStringView::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__1>
            (&local_260,&local_388,&local_3a0);
  local_320 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"set_args",&local_3c1);
  local_3d8.p = (Printer **)local_18;
  local_3d8.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularStringView::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__2>
            (&local_1a8,&local_3c0,&local_3d8);
  local_320 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"check_hasbit",&local_3f9)
  ;
  local_410.p = (Printer **)local_18;
  local_410.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularStringView::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__3>
            (&local_f0,&local_3f8,&local_410);
  local_411 = 0;
  local_38 = &local_318;
  local_30 = 4;
  v._M_len = 4;
  v._M_array = local_38;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_428,
             "\n        inline ::absl::string_view $Msg$::$name$() const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          $if_IsDefault$;\n          return _internal_$name_internal$();\n        }\n        template <typename Arg_>\n        PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $PrepareSplitMessageForWrite$;\n          $update_hasbit$;\n          $field_$.Set(static_cast<Arg_&&>(arg), $set_args$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        inline ::absl::string_view $Msg$::_internal_$name_internal$() const {\n          $TsanDetectConcurrentRead$;\n          $check_hasbit$;\n          return $field_$.Get();\n        }\n        inline void $Msg$::_internal_set_$name_internal$(::absl::string_view value) {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          $field_$.Set(value, $set_args$);\n        }\n      "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit
            (p,local_28._M_allocated_capacity,local_28._8_8_,local_428._M_len,local_428._M_str);
  local_498 = (Sub *)&local_38;
  do {
    local_498 = local_498 + -1;
    protobuf::io::Printer::Sub::~Sub(local_498);
  } while (local_498 != &local_318);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
  auVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_440,
               "\n      inline bool $Msg$::_internal_$name_internal$_donated() const {\n        return $inlined_string_donated$;\n      }\n    "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit((Printer *)auVar1,local_440._M_len,local_440._M_str);
  }
  return;
}

Assistant:

void SingularStringView::GenerateInlineAccessorDefinitions(
    io::Printer* p) const {
  p->Emit(
      {
          {"if_IsDefault",
           [&] {
             if (EmptyDefault() || is_oneof() || use_micro_string()) return;
             p->Emit(R"cc(
               if ($field_$.IsDefault()) {
                 return $default_variable_field$.get();
               }
             )cc");
           }},
          {"update_hasbit", [&] { UpdateHasbitSet(p, is_oneof()); }},
          {"set_args", [&] { ArgsForSetter(p, is_inlined()); }},
          {"check_hasbit",
           [&] {
             if (!is_oneof()) return;
             p->Emit(R"cc(
               if ($not_has_field$) {
                 return $kDefaultStr$;
               }
             )cc");
           }},
      },
      R"cc(
        inline ::absl::string_view $Msg$::$name$() const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          $if_IsDefault$;
          return _internal_$name_internal$();
        }
        template <typename Arg_>
        PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $update_hasbit$;
          $field_$.Set(static_cast<Arg_&&>(arg), $set_args$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        inline ::absl::string_view $Msg$::_internal_$name_internal$() const {
          $TsanDetectConcurrentRead$;
          $check_hasbit$;
          return $field_$.Get();
        }
        inline void $Msg$::_internal_set_$name_internal$(::absl::string_view value) {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          $field_$.Set(value, $set_args$);
        }
      )cc");

  if (is_inlined()) {
    p->Emit(R"cc(
      inline bool $Msg$::_internal_$name_internal$_donated() const {
        return $inlined_string_donated$;
      }
    )cc");
  }
}